

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::TableGetHeaderAngledMaxLabelWidth(void)

{
  float fVar1;
  ImGuiTable *table;
  ImGuiContext *pIVar2;
  char *text;
  long lVar3;
  int column_n;
  ulong uVar4;
  uint uVar5;
  ImVec2 IVar6;
  float fVar7;
  
  pIVar2 = GImGui;
  table = GImGui->CurrentTable;
  fVar7 = 0.0;
  lVar3 = 0;
  for (uVar4 = 0; (long)uVar4 < (long)table->ColumnsCount; uVar4 = uVar4 + 1) {
    if (((table->EnabledMaskByIndex[uVar4 >> 5 & 0x7ffffff] >> ((uint)uVar4 & 0x1f) & 1) != 0) &&
       ((*(byte *)((long)&((table->Columns).Data)->Flags + lVar3 + 2) & 4) != 0)) {
      text = TableGetColumnName(table,(uint)uVar4);
      IVar6 = CalcTextSize(text,(char *)0x0,true,-1.0);
      uVar5 = -(uint)(IVar6.x <= fVar7);
      fVar7 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)IVar6.x);
    }
    lVar3 = lVar3 + 0x70;
  }
  fVar1 = (pIVar2->Style).CellPadding.y;
  return fVar1 + fVar1 + fVar7;
}

Assistant:

float ImGui::TableGetHeaderAngledMaxLabelWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    float width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
            if (table->Columns[column_n].Flags & ImGuiTableColumnFlags_AngledHeader)
                width = ImMax(width, CalcTextSize(TableGetColumnName(table, column_n), NULL, true).x);
    return width + g.Style.CellPadding.y * 2.0f; // Swap padding
}